

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O1

HighsInt __thiscall
HighsCliqueTable::shrinkToNeighbourhood
          (HighsCliqueTable *this,vector<int,_std::allocator<int>_> *neighbourhoodInds,
          int64_t *numQueries,CliqueVar v,CliqueVar *q,HighsInt N)

{
  int iVar1;
  pointer piVar2;
  long lVar3;
  
  queryNeighbourhood(this,neighbourhoodInds,numQueries,v,q,N);
  piVar2 = (neighbourhoodInds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar1 = (int)((ulong)((long)(neighbourhoodInds->super__Vector_base<int,_std::allocator<int>_>).
                              _M_impl.super__Vector_impl_data._M_finish - (long)piVar2) >> 2);
  if (0 < iVar1) {
    lVar3 = 0;
    do {
      q[lVar3] = q[piVar2[lVar3]];
      lVar3 = lVar3 + 1;
      piVar2 = (neighbourhoodInds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      iVar1 = (int)((ulong)((long)(neighbourhoodInds->super__Vector_base<int,_std::allocator<int>_>)
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)piVar2) >> 2);
    } while (lVar3 < iVar1);
  }
  return iVar1;
}

Assistant:

HighsInt HighsCliqueTable::shrinkToNeighbourhood(
    std::vector<HighsInt>& neighbourhoodInds, int64_t& numQueries, CliqueVar v,
    CliqueVar* q, HighsInt N) {
  queryNeighbourhood(neighbourhoodInds, numQueries, v, q, N);

  for (HighsInt i = 0; i < (HighsInt)neighbourhoodInds.size(); ++i)
    q[i] = q[neighbourhoodInds[i]];

  return neighbourhoodInds.size();
}